

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  pointer ppTVar8;
  ostream *poVar9;
  int iVar10;
  long lVar11;
  TestCase *this_00;
  uint uVar12;
  ulong uVar13;
  pointer ppEVar14;
  long lVar15;
  byte bVar16;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar17;
  timeval now;
  timeval local_50;
  uint local_40;
  int local_3c;
  long local_38;
  
  if (g_init_gtest_count == 0) {
    puts(
        "\nThis test program did NOT call ::testing::InitGoogleTest before calling RUN_ALL_TESTS().  Please fix it."
        );
    bVar6 = false;
  }
  else {
    bVar6 = true;
    if (g_help_flag == '\0') {
      PostFlagParsingInit(this);
      WriteToShardStatusFileIfNeeded();
      pIVar1 = (this->internal_run_death_test_flag_).ptr_;
      bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                          pIVar1 != (InternalRunDeathTestFlag *)0x0);
      local_3c = FilterTests(this,(uint)!bVar5);
      if (FLAGS_gtest_list_tests == '\x01') {
        ListTestsMatchingFilter(this);
      }
      else {
        iVar10 = 0;
        if (FLAGS_gtest_shuffle == '\x01') {
          iVar10 = FLAGS_gtest_random_seed;
          if (FLAGS_gtest_random_seed == 0) {
            gettimeofday(&local_50,(__timezone_ptr_t)0x0);
            iVar10 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_50.tv_usec),8) >> 7)
                     - (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_50.tv_usec),0xc) >> 0x1f)
                     ) + (int)local_50.tv_sec * 1000;
          }
          iVar10 = (iVar10 - 1U) % 99999 + 1;
        }
        this->random_seed_ = iVar10;
        pTVar2 = (this->listeners_).repeater_;
        gettimeofday(&local_50,(__timezone_ptr_t)0x0);
        this->start_timestamp_ =
             local_50.tv_usec / 1000 + CONCAT44(local_50.tv_sec._4_4_,(int)local_50.tv_sec) * 1000;
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2);
        uVar12 = 1;
        if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
          uVar12 = FLAGS_gtest_repeat;
        }
        if (uVar12 == 0) {
          bVar6 = true;
        }
        else {
          uVar13 = 0;
          bVar16 = 0;
          local_40 = uVar12;
          do {
            ppTVar3 = (this->test_cases_).
                      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (ppTVar8 = (this->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppTVar8 != ppTVar3;
                ppTVar8 = ppTVar8 + 1) {
              TestCase::ClearResult(*ppTVar8);
            }
            gettimeofday(&local_50,(__timezone_ptr_t)0x0);
            lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_usec),8);
            local_38 = CONCAT44(local_50.tv_sec._4_4_,(int)local_50.tv_sec);
            if (local_3c < 1) {
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar13);
            }
            else {
              if (FLAGS_gtest_shuffle == '\x01') {
                (this->random_).state_ = this->random_seed_;
                ShuffleTests(this);
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar13);
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
              ppEVar17 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              for (ppEVar14 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppEVar14 != ppEVar17;
                  ppEVar14 = ppEVar14 + 1) {
                (**(code **)(*(long *)*ppEVar14 + 0x10))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
              bVar6 = Test::HasFatalFailure();
              if ((!bVar6) &&
                 (ppTVar8 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 0 < (int)((ulong)((long)(this->test_cases_).
                                         super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8)
                          >> 3))) {
                lVar15 = 0;
                do {
                  piVar4 = (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar12 = 0xffffffff;
                  if (lVar15 < (int)((ulong)((long)(this->test_case_indices_).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar4) >> 2)) {
                    uVar12 = piVar4[lVar15];
                  }
                  if ((int)uVar12 < 0) {
                    this_00 = (TestCase *)0x0;
                  }
                  else {
                    this_00 = ppTVar8[uVar12];
                  }
                  TestCase::Run(this_00);
                  lVar15 = lVar15 + 1;
                  ppTVar8 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (lVar15 < (int)((ulong)((long)(this->test_cases_).
                                                                                                            
                                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppTVar8) >> 3));
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xb])
                        (pTVar2,this->parent_);
              ppEVar14 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              for (ppEVar17 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish; ppEVar17 != ppEVar14;
                  ppEVar17 = ppEVar17 + -1) {
                (**(code **)(*(long *)ppEVar17[-1] + 0x18))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2);
            }
            gettimeofday(&local_50,(__timezone_ptr_t)0x0);
            this->elapsed_time_ =
                 (CONCAT44(local_50.tv_sec._4_4_,(int)local_50.tv_sec) - local_38) * 1000 +
                 local_50.tv_usec / 1000 + ((lVar11 >> 7) - (lVar11 >> 0x3f));
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])
                      (pTVar2,this->parent_,uVar13);
            bVar6 = Passed(this);
            if (!bVar6) {
              bVar16 = 1;
            }
            UnshuffleTests(this);
            if (FLAGS_gtest_shuffle == '\x01') {
              iVar10 = this->random_seed_;
              if (0x1869e < iVar10 - 1U) {
                GTestLog::GTestLog((GTestLog *)&local_50,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/thirdparty/gmock/gmock-gtest-all.cc"
                                   ,0x22a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition 1 <= seed && seed <= kMaxRandomSeed failed. ",0x36);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Invalid random seed ",0x14);
                poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," - must be in [1, ",0x12)
                ;
                poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,99999);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"].",2);
                GTestLog::~GTestLog((GTestLog *)&local_50);
              }
              iVar7 = iVar10 + 1;
              if (0x1869e < iVar10) {
                iVar7 = 1;
              }
              this->random_seed_ = iVar7;
            }
            uVar12 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar12;
          } while (uVar12 != local_40 || (int)local_40 < 0);
          bVar6 = (bool)(bVar16 ^ 1);
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
      }
    }
  }
  return bVar6;
}

Assistant:

static bool GTestIsInitialized() { return g_init_gtest_count != 0; }